

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O3

void __thiscall
flatbuffers::php::PhpGenerator::GetMemberOfVectorOfStruct
          (PhpGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  Value *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 *puVar3;
  long *plVar4;
  size_t sVar5;
  size_type *psVar6;
  ulong *puVar7;
  Type *extraout_RDX;
  Type *extraout_RDX_00;
  Type *extraout_RDX_01;
  Type *extraout_RDX_02;
  Type *extraout_RDX_03;
  Type *extraout_RDX_04;
  Type *pTVar8;
  undefined8 uVar9;
  _Alloc_hider _Var10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  StructDef *local_58;
  Type local_50;
  
  local_50.base_type = (field->value).type.element;
  local_50.fixed_length = (field->value).type.fixed_length;
  local_50.element = BASE_TYPE_NONE;
  local_50.struct_def._0_4_ = *(undefined4 *)&(field->value).type.struct_def;
  local_50.struct_def._4_4_ = *(undefined4 *)((long)&(field->value).type.struct_def + 4);
  local_50.enum_def._0_4_ = *(undefined4 *)&(field->value).type.enum_def;
  local_50.enum_def._4_4_ = *(undefined4 *)((long)&(field->value).type.enum_def + 4);
  paVar1 = &local_f8.field_2;
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,Indent_abi_cxx11_,DAT_003ebcb0 + Indent_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_f8);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_f8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,Indent_abi_cxx11_,DAT_003ebcb0 + Indent_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_b8);
  this_00 = &field->value;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,
             *(char **)(GenTypeBasic[abi:cxx11](flatbuffers::Type_const&)::ctypename +
                       (ulong)(this_00->type).base_type * 8),(allocator<char> *)&local_78);
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    uVar9 = local_b8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_98._M_string_length + local_b8._M_string_length) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      uVar9 = local_98.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_98._M_string_length + local_b8._M_string_length) goto LAB_00266889;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_98,0,(char *)0x0,(ulong)local_b8._M_dataplus._M_p);
  }
  else {
LAB_00266889:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_98._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  psVar6 = puVar3 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_d8.field_2._M_allocated_capacity = *psVar6;
    local_d8.field_2._8_8_ = puVar3[3];
  }
  else {
    local_d8.field_2._M_allocated_capacity = *psVar6;
    local_d8._M_dataplus._M_p = (pointer)*puVar3;
  }
  local_d8._M_string_length = puVar3[1];
  *puVar3 = psVar6;
  puVar3[1] = 0;
  *(undefined1 *)psVar6 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_d8);
  psVar6 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_f8.field_2._M_allocated_capacity = *psVar6;
    local_f8.field_2._8_8_ = plVar4[3];
    local_f8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_f8.field_2._M_allocated_capacity = *psVar6;
    local_f8._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_f8._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_f8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  local_58 = struct_def;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,Indent_abi_cxx11_,DAT_003ebcb0 + Indent_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_f8);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_f8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,Indent_abi_cxx11_,DAT_003ebcb0 + Indent_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_f8);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_f8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  ConvertCase(&local_f8,(string *)field,kUpperCamel,kSnake);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_f8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)code_ptr);
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,Indent_abi_cxx11_,DAT_003ebcb0 + Indent_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_f8);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_f8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_);
  puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_98);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  puVar7 = puVar3 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar7) {
    local_b8.field_2._M_allocated_capacity = *puVar7;
    local_b8.field_2._8_8_ = puVar3[3];
  }
  else {
    local_b8.field_2._M_allocated_capacity = *puVar7;
    local_b8._M_dataplus._M_p = (pointer)*puVar3;
  }
  local_b8._M_string_length = puVar3[1];
  *puVar3 = puVar7;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  NumToString<unsigned_short>(&local_78,(field->value).offset);
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    uVar9 = local_b8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_78._M_string_length + local_b8._M_string_length) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      uVar9 = local_78.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_78._M_string_length + local_b8._M_string_length) goto LAB_00266be3;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_78,0,(char *)0x0,(ulong)local_b8._M_dataplus._M_p);
  }
  else {
LAB_00266be3:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_78._M_dataplus._M_p);
  }
  puVar7 = puVar3 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar7) {
    local_d8.field_2._M_allocated_capacity = *puVar7;
    local_d8.field_2._8_8_ = puVar3[3];
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  }
  else {
    local_d8.field_2._M_allocated_capacity = *puVar7;
    local_d8._M_dataplus._M_p = (pointer)*puVar3;
  }
  local_d8._M_string_length = puVar3[1];
  *puVar3 = puVar7;
  puVar3[1] = 0;
  *(undefined1 *)puVar7 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_d8);
  psVar6 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_f8.field_2._M_allocated_capacity = *psVar6;
    local_f8.field_2._8_8_ = plVar4[3];
    local_f8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_f8.field_2._M_allocated_capacity = *psVar6;
    local_f8._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_f8._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_f8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_d8);
  psVar6 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_f8.field_2._M_allocated_capacity = *psVar6;
    local_f8.field_2._8_8_ = plVar4[3];
    local_f8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_f8.field_2._M_allocated_capacity = *psVar6;
    local_f8._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_f8._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_f8._M_dataplus._M_p);
  pTVar8 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    pTVar8 = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    pTVar8 = extraout_RDX_01;
  }
  GenTypeGet_abi_cxx11_(&local_b8,(PhpGenerator *)this_00,pTVar8);
  ConvertCase(&local_d8,&local_b8,kUpperCamel,kSnake);
  puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
  puVar7 = puVar3 + 2;
  paVar2 = &local_d8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar7) {
    local_f8.field_2._M_allocated_capacity = *puVar7;
    local_f8.field_2._8_8_ = puVar3[3];
    local_f8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_f8.field_2._M_allocated_capacity = *puVar7;
    local_f8._M_dataplus._M_p = (pointer)*puVar3;
  }
  local_f8._M_string_length = puVar3[1];
  *puVar3 = puVar7;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_f8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  switch((this_00->type).base_type) {
  case BASE_TYPE_STRING:
    break;
  case BASE_TYPE_VECTOR:
    if (local_50.base_type != BASE_TYPE_STRUCT) goto switchD_00266ec5_default;
    std::operator+(&local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_);
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
    paVar1 = &local_f8.field_2;
    puVar7 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar7) {
      local_f8.field_2._M_allocated_capacity = *puVar7;
      local_f8.field_2._8_8_ = puVar3[3];
      local_f8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_f8.field_2._M_allocated_capacity = *puVar7;
      local_f8._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_f8._M_string_length = puVar3[1];
    *puVar3 = puVar7;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_f8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if (*(char *)(CONCAT44(local_50.struct_def._4_4_,local_50.struct_def._0_4_) + 0x110) == '\x01')
    {
      std::__cxx11::string::append((char *)code_ptr);
      sVar5 = InlineSize(&local_50);
      NumToString<unsigned_long>(&local_f8,sVar5);
      std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_f8._M_dataplus._M_p);
      uVar9 = local_f8.field_2._M_allocated_capacity;
      _Var10._M_p = local_f8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
LAB_00267430:
        operator_delete(_Var10._M_p,uVar9 + 1);
      }
    }
    else {
      std::__cxx11::string::append((char *)code_ptr);
      sVar5 = InlineSize(&local_50);
      NumToString<unsigned_long>(&local_d8,sVar5);
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
      puVar7 = puVar3 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar7) {
        local_f8.field_2._M_allocated_capacity = *puVar7;
        local_f8.field_2._8_8_ = puVar3[3];
        local_f8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_f8.field_2._M_allocated_capacity = *puVar7;
        local_f8._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_f8._M_string_length = puVar3[1];
      *puVar3 = puVar7;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_f8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      uVar9 = local_d8.field_2._M_allocated_capacity;
      _Var10._M_p = local_d8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar2) goto LAB_00267430;
    }
    break;
  case BASE_TYPE_STRUCT:
    if (local_58->fixed == true) {
      std::operator+(&local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &Indent_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &Indent_abi_cxx11_);
      std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_f8._M_dataplus._M_p);
      paVar1 = &local_f8.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      NumToString<unsigned_short>(&local_b8,(field->value).offset);
      puVar3 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x36fe1c);
      puVar7 = puVar3 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar7) {
        local_d8.field_2._M_allocated_capacity = *puVar7;
        local_d8.field_2._8_8_ = puVar3[3];
        local_d8._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_d8.field_2._M_allocated_capacity = *puVar7;
        local_d8._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_d8._M_string_length = puVar3[1];
      *puVar3 = puVar7;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_d8);
      puVar7 = (ulong *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar7) {
        local_f8.field_2._M_allocated_capacity = *puVar7;
        local_f8.field_2._8_8_ = plVar4[3];
        local_f8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_f8.field_2._M_allocated_capacity = *puVar7;
        local_f8._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_f8._M_string_length = plVar4[1];
      *plVar4 = (long)puVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_f8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      uVar9 = local_b8.field_2._M_allocated_capacity;
      _Var10._M_p = local_b8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p == &local_b8.field_2) goto switchD_00266ec5_default;
      goto LAB_002673d7;
    }
    std::operator+(&local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_);
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
    puVar7 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar7) {
      local_f8.field_2._M_allocated_capacity = *puVar7;
      local_f8.field_2._8_8_ = puVar3[3];
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    }
    else {
      local_f8.field_2._M_allocated_capacity = *puVar7;
      local_f8._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_f8._M_string_length = puVar3[1];
    *puVar3 = puVar7;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_f8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)code_ptr);
    break;
  case BASE_TYPE_UNION:
    std::operator+(&local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_d8);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_f8.field_2._M_allocated_capacity = *psVar6;
      local_f8.field_2._8_8_ = plVar4[3];
      local_f8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_f8.field_2._M_allocated_capacity = *psVar6;
      local_f8._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_f8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_f8._M_dataplus._M_p);
    pTVar8 = extraout_RDX_02;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      pTVar8 = extraout_RDX_03;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      pTVar8 = extraout_RDX_04;
    }
    GenGetter_abi_cxx11_(&local_d8,(PhpGenerator *)this_00,pTVar8);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_d8);
    puVar7 = (ulong *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar7) {
      local_f8.field_2._M_allocated_capacity = *puVar7;
      local_f8.field_2._8_8_ = plVar4[3];
      local_f8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_f8.field_2._M_allocated_capacity = *puVar7;
      local_f8._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_f8._M_string_length = plVar4[1];
    *plVar4 = (long)puVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_f8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    uVar9 = local_d8.field_2._M_allocated_capacity;
    _Var10._M_p = local_d8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p == paVar2) goto switchD_00266ec5_default;
LAB_002673d7:
    operator_delete(_Var10._M_p,uVar9 + 1);
  default:
    goto switchD_00266ec5_default;
  }
  std::__cxx11::string::append((char *)code_ptr);
switchD_00266ec5_default:
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,Indent_abi_cxx11_,DAT_003ebcb0 + Indent_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_f8);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_f8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GetMemberOfVectorOfStruct(const StructDef &struct_def,
                                 const FieldDef &field, std::string *code_ptr) {
    std::string &code = *code_ptr;
    auto vectortype = field.value.type.VectorType();

    code += Indent + "/**\n";
    code += Indent + " * @return" + GenTypeBasic(field.value.type) + "\n";
    code += Indent + " */\n";
    code += Indent + "public function get";
    code += ConvertCase(field.name, Case::kUpperCamel);
    code += "($j)\n";
    code += Indent + "{\n";
    code += Indent + Indent + "$o = $this->__offset(" +
            NumToString(field.value.offset) + ");\n";
    code += Indent + Indent + "$obj = new ";
    code +=
        ConvertCase(GenTypeGet(field.value.type), Case::kUpperCamel) + "();\n";

    switch (field.value.type.base_type) {
      case BASE_TYPE_STRUCT:
        if (struct_def.fixed) {
          code += Indent + Indent;
          code += "return $o != 0 ? $obj->init($this->bb_pos +" +
                  NumToString(field.value.offset) + ", $this->bb) : null;\n";
        } else {
          code += Indent + Indent + "return $o != 0 ? $obj->init(";
          code += field.value.type.struct_def->fixed
                      ? "$o + $this->bb_pos"
                      : "$this->__indirect($o + $this->bb_pos)";
          code += ", $this->bb) : null;\n";
        }
        break;
      case BASE_TYPE_STRING:
        code += "// base_type_string\n";
        // TODO(chobie): do we need this?
        break;
      case BASE_TYPE_VECTOR:
        if (vectortype.base_type == BASE_TYPE_STRUCT) {
          code += Indent + Indent + "return $o != 0 ? $obj->init(";
          if (vectortype.struct_def->fixed) {
            code += "$this->__vector($o) + $j *";
            code += NumToString(InlineSize(vectortype));
          } else {
            code += "$this->__indirect($this->__vector($o) + $j * ";
            code += NumToString(InlineSize(vectortype)) + ")";
          }
          code += ", $this->bb) : null;\n";
        }
        break;
      case BASE_TYPE_UNION:
        code += Indent + Indent + "return $o != 0 ? $this->";
        code += GenGetter(field.value.type) + "($obj, $o); null;\n";
        break;
      default: break;
    }

    code += Indent + "}\n\n";
  }